

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O2

void duckdb::GlobFunction(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  bool bVar1;
  FunctionData *pFVar2;
  GlobalTableFunctionState *pGVar3;
  MultiFileList *this;
  reference this_00;
  idx_t index;
  OpenFileInfo file;
  OpenFileInfo local_c0;
  string local_90;
  Value local_70;
  
  pFVar2 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  index = 0;
  do {
    if (0x7ff < index) break;
    local_c0.path._M_dataplus._M_p = (pointer)&local_c0.path.field_2;
    local_c0.path._M_string_length = 0;
    local_c0.path.field_2._M_local_buf[0] = '\0';
    local_c0.extended_info.internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c0.extended_info.internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)(pFVar2 + 4));
    bVar1 = MultiFileList::Scan(this,(MultiFileListScanData *)(pGVar3 + 1),&local_c0);
    if (bVar1) {
      this_00 = vector<duckdb::Vector,_true>::get<true>(&output->data,0);
      ::std::__cxx11::string::string((string *)&local_90,(string *)&local_c0);
      Value::Value(&local_70,&local_90);
      Vector::SetValue(this_00,index,&local_70);
      index = index + 1;
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    OpenFileInfo::~OpenFileInfo(&local_c0);
  } while (bVar1);
  output->count = index;
  return;
}

Assistant:

static void GlobFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<GlobFunctionBindData>();
	auto &state = data_p.global_state->Cast<GlobFunctionState>();

	idx_t count = 0;
	while (count < STANDARD_VECTOR_SIZE) {
		OpenFileInfo file;
		if (!bind_data.file_list->Scan(state.file_list_scan, file)) {
			break;
		}
		output.data[0].SetValue(count++, file.path);
	}
	output.SetCardinality(count);
}